

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS
ref_smooth_tri_quality
          (REF_GRID ref_grid,REF_INT node,REF_INT id,REF_INT *nodes,REF_DBL *uv,REF_DBL *dq_duv,
          REF_DBL step,REF_DBL *qnew)

{
  REF_NODE ref_node_00;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL area;
  REF_DBL min_uv_area;
  REF_DBL uvnew [2];
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_DBL step_local;
  REF_DBL *dq_duv_local;
  REF_DBL *uv_local;
  REF_INT *nodes_local;
  REF_INT id_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  min_uv_area = step * *dq_duv + *uv;
  uvnew[0] = step * dq_duv[1] + uv[1];
  ref_grid_local._4_4_ = ref_geom_add(ref_grid->geom,node,2,id,&min_uv_area);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = ref_smooth_tri_uv_area_around(ref_grid,node,&area);
    if (ref_grid_local._4_4_ == 0) {
      if (ref_node_00->min_uv_area <= area) {
        ref_grid_local._4_4_ = ref_geom_constrain(ref_grid,node);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ =
               ref_node_tri_area(ref_node_00,nodes,(REF_DBL *)&ref_private_macro_code_rss_1);
          if (ref_grid_local._4_4_ == 0) {
            if (ref_node_00->min_volume < _ref_private_macro_code_rss_1) {
              ref_grid_local._4_4_ = ref_node_tri_quality(ref_node_00,nodes,qnew);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x178,"ref_smooth_tri_quality",(ulong)ref_grid_local._4_4_,"qual");
              }
            }
            else {
              *qnew = -2.0;
              ref_grid_local._4_4_ = 0;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x172,"ref_smooth_tri_quality",(ulong)ref_grid_local._4_4_,"vol");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x16f,"ref_smooth_tri_quality",(ulong)ref_grid_local._4_4_,"constrain");
        }
      }
      else {
        *qnew = -3.0;
        ref_grid_local._4_4_ = 0;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x169,"ref_smooth_tri_quality",(ulong)ref_grid_local._4_4_,"set uv");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x167,
           "ref_smooth_tri_quality",(ulong)ref_grid_local._4_4_,"set uv");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tri_quality(REF_GRID ref_grid,
                                                 REF_INT node, REF_INT id,
                                                 REF_INT *nodes, REF_DBL *uv,
                                                 REF_DBL *dq_duv, REF_DBL step,
                                                 REF_DBL *qnew) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DBL uvnew[2];
  REF_DBL min_uv_area, area;
  uvnew[0] = uv[0] + step * dq_duv[0];
  uvnew[1] = uv[1] + step * dq_duv[1];

  RSS(ref_geom_add(ref_geom, node, REF_GEOM_FACE, id, uvnew), "set uv");

  RSS(ref_smooth_tri_uv_area_around(ref_grid, node, &min_uv_area), "set uv");
  if (min_uv_area < ref_node_min_uv_area(ref_node)) {
    *qnew = -3.0;
    return REF_SUCCESS;
  }

  RSS(ref_geom_constrain(ref_grid, node), "constrain");

  /* for twod, should not hurt 3D */
  RSS(ref_node_tri_area(ref_node, nodes, &area), "vol");
  if (area <= ref_node_min_volume(ref_node)) {
    *qnew = -2.0;
    return REF_SUCCESS;
  }

  RSS(ref_node_tri_quality(ref_node, nodes, qnew), "qual");

  return REF_SUCCESS;
}